

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcQueueHelper.h
# Opt level: O3

bool __thiscall
helics::ipc::SharedQueueState::setState(SharedQueueState *this,queue_state_t newState)

{
  boost::interprocess::ipcdetail::
  timeout_when_locking_aware_lock<boost::interprocess::ipcdetail::posix_mutex>((posix_mutex *)this);
  this->state = newState;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return true;
}

Assistant:

bool setState(queue_state_t newState)
        {
            bool success = false;
            int tries = 0;
            while (!success) {
                try {
                    boost::interprocess::scoped_lock<ipcmutex> lock(data_lock);
                    state = newState;
                    success = true;
                }
                catch (const boost::interprocess::lock_exception&) {
                    std::this_thread::sleep_for(std::chrono::milliseconds(100));
                    ++tries;
                    if (tries > 20) {
                        std::cout << "error in connecting to process lock\n";
                        state = newState;
                        return false;
                    }
                }
            }
            return success;
        }